

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void * __thiscall CVmVarHeapHybrid::alloc_mem(CVmVarHeapHybrid *this,size_t siz,CVmObject *param_2)

{
  ulong *puVar1;
  CVmVarHeapHybrid_head *pCVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var_00;
  size_t sVar5;
  undefined4 extraout_var;
  
  puVar1 = &this->objtab_->bytes_since_gc_;
  *puVar1 = *puVar1 + siz;
  sVar5 = 0;
  do {
    if (this->cell_heap_cnt_ == sVar5) {
      iVar3 = (*(this->malloc_heap_->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block[2])
                        ();
      lVar4 = CONCAT44(extraout_var,iVar3);
LAB_00298c3f:
      return (void *)(lVar4 + 8);
    }
    pCVar2 = this->cell_heaps_[sVar5];
    if (siz <= pCVar2->cell_size_) {
      iVar3 = (*(pCVar2->super_CVmVarHeapHybrid_block)._vptr_CVmVarHeapHybrid_block[2])(pCVar2);
      lVar4 = CONCAT44(extraout_var_00,iVar3);
      goto LAB_00298c3f;
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

void *CVmVarHeapHybrid::alloc_mem(size_t siz, CVmObject *)
{
    CVmVarHeapHybrid_head **subheap;
    size_t i;

    /* count the gc statistics if desired */
    IF_GC_STATS(gc_stats.count_alloc_bytes(siz));

    /* count the allocation */
    objtab_->count_alloc(siz);

    /* scan for a cell-based subheap that can handle the request */
    for (i = 0, subheap = cell_heaps_ ; i < cell_heap_cnt_ ; ++i, ++subheap)
    {
        /* 
         *   If it will fit in this one's cell size, allocate it from this
         *   subheap.  Note that we must adjust the return pointer so that
         *   it points to the caller-visible portion of the block returned
         *   from the subheap, which immediately follows the internal
         *   header.  
         */
        if (siz <= (*subheap)->get_cell_size())
        {
            CVmVarHeapHybrid_hdr *hdr = (*subheap)->alloc(siz);
            IF_GC_STATS(hdr->siz = siz);
            return (void *)(hdr + 1);
        }
    }

    /*
     *   We couldn't find a cell-based manager that can handle a block
     *   this large.  Allocate the block from the default malloc heap.
     *   Note that the caller-visible block is the part that immediately
     *   follows our internal header, so we must adjust the return pointer
     *   accordingly.  
     */
    CVmVarHeapHybrid_hdr *hdr = malloc_heap_->alloc(siz);
    IF_GC_STATS(hdr->siz = siz);
    return (void *)(hdr + 1);
}